

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O1

void __thiscall nonius::detail::option::option(option *this,option *param_1)

{
  pointer pcVar1;
  
  (this->long_form)._M_dataplus._M_p = (pointer)&(this->long_form).field_2;
  pcVar1 = (param_1->long_form)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + (param_1->long_form)._M_string_length);
  (this->short_form)._M_dataplus._M_p = (pointer)&(this->short_form).field_2;
  pcVar1 = (param_1->short_form)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->short_form,pcVar1,pcVar1 + (param_1->short_form)._M_string_length);
  (this->description)._M_dataplus._M_p = (pointer)&(this->description).field_2;
  pcVar1 = (param_1->description)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->description,pcVar1,pcVar1 + (param_1->description)._M_string_length);
  (this->argument)._M_dataplus._M_p = (pointer)&(this->argument).field_2;
  pcVar1 = (param_1->argument)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->argument,pcVar1,pcVar1 + (param_1->argument)._M_string_length);
  this->multiple = param_1->multiple;
  return;
}

Assistant:

bool matches_short(std::string const& s) const {
                return s == ("-" + short_form);
            }